

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O0

char * test_quaternion_multiply_identity(void)

{
  int iVar1;
  undefined1 local_70 [8];
  quaternion q;
  quaternion qB;
  quaternion qA;
  
  qB.field_0.q[3] = 1.0;
  quaternion_identity((quaternion *)((long)&q.field_0 + 0x18));
  quaternion_set((quaternion *)local_70,(quaternion *)((long)&qB.field_0 + 0x18));
  quaternion_multiply((quaternion *)local_70,(quaternion *)((long)&q.field_0 + 0x18));
  iVar1 = quaternion_equals((quaternion *)local_70,(quaternion *)((long)&qB.field_0 + 0x18));
  if (iVar1 == 0) {
    qA.field_0.q[3] = (double)anon_var_dwarf_1dd;
  }
  else {
    qA.field_0.q[3] = 0.0;
  }
  return (char *)qA.field_0.q[3];
}

Assistant:

static char *test_quaternion_multiply_identity(void)
{
	struct quaternion qA, qB, q;

	qA.x = 1;
	qA.y = 2;
	qA.z = 3;
	qA.w = 4;

	quaternion_identity(&qB);

	quaternion_set(&q, &qA);
	quaternion_multiply(&q, &qB);

	test_assert(quaternion_equals(&q, &qA));

	return NULL;
}